

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::autoParent(tst_RoleMaskProxyModel *this)

{
  char cVar1;
  QObject *this_00;
  RoleMaskProxyModel *this_01;
  QSignalSpy testItemDestroyedSpy;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_01 = (RoleMaskProxyModel *)operator_new(0x18);
  RoleMaskProxyModel::RoleMaskProxyModel(this_01,this_00);
  QSignalSpy::QSignalSpy(&testItemDestroyedSpy,(QObject *)this_01,"2destroyed(QObject *)");
  cVar1 = QTest::qVerify(testItemDestroyedSpy.sig.d.size != 0,"testItemDestroyedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x72);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
    QTest::qCompare(testItemDestroyedSpy.super_QList<QList<QVariant>_>.d.size,1,
                    "testItemDestroyedSpy.count()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                    ,0x74);
  }
  QSignalSpy::~QSignalSpy(&testItemDestroyedSpy);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::autoParent()
{
    QObject *parentObj = new QObject;
    auto testItem = new RoleMaskProxyModel(parentObj);
    QSignalSpy testItemDestroyedSpy(testItem, SIGNAL(destroyed(QObject *)));
    QVERIFY(testItemDestroyedSpy.isValid());
    delete parentObj;
    QCOMPARE(testItemDestroyedSpy.count(), 1);
}